

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O2

void __thiscall
cmGeneratorExpressionEvaluationFile::CreateOutputFile
          (cmGeneratorExpressionEvaluationFile *this,string *config)

{
  cmGlobalGenerator *this_00;
  char *pcVar1;
  cmSourceFile *this_01;
  pointer language;
  allocator local_c9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  string local_a0;
  string name;
  _Rb_tree<const_cmTarget_*,_const_cmTarget_*,_std::_Identity<const_cmTarget_*>,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
  local_60;
  
  enabledLanguages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  enabledLanguages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  enabledLanguages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = cmMakefile::GetGlobalGenerator(this->Makefile);
  cmGlobalGenerator::GetEnabledLanguages(this_00,&enabledLanguages);
  for (language = enabledLanguages.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      language !=
      enabledLanguages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; language = language + 1) {
    pcVar1 = cmCompiledGeneratorExpression::Evaluate
                       ((this->OutputFileExpr).x_,this->Makefile,config,false,(cmTarget *)0x0,
                        (cmTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,language);
    std::__cxx11::string::string((string *)&name,pcVar1,(allocator *)&local_a0);
    this_01 = cmMakefile::GetOrCreateSource(this->Makefile,&name,false);
    std::__cxx11::string::string((string *)&local_a0,"GENERATED",&local_c9);
    cmSourceFile::SetProperty(this_01,&local_a0,"1");
    std::__cxx11::string::~string((string *)&local_a0);
    std::
    _Rb_tree<const_cmTarget_*,_const_cmTarget_*,_std::_Identity<const_cmTarget_*>,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
    ::_Rb_tree(&local_60,&(((this->OutputFileExpr).x_)->SourceSensitiveTargets)._M_t);
    cmGlobalGenerator::SetFilenameTargetDepends
              (this_00,this_01,
               (set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
                *)&local_60);
    std::
    _Rb_tree<const_cmTarget_*,_const_cmTarget_*,_std::_Identity<const_cmTarget_*>,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
    ::~_Rb_tree(&local_60);
    std::__cxx11::string::~string((string *)&name);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&enabledLanguages);
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::CreateOutputFile(
                                              std::string const& config)
{
  std::vector<std::string> enabledLanguages;
  cmGlobalGenerator *gg = this->Makefile->GetGlobalGenerator();
  gg->GetEnabledLanguages(enabledLanguages);

  for(std::vector<std::string>::const_iterator le = enabledLanguages.begin();
      le != enabledLanguages.end(); ++le)
    {
    std::string name = this->OutputFileExpr->Evaluate(this->Makefile, config,
                                                      false, 0, 0, 0, *le);
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(name);
    sf->SetProperty("GENERATED", "1");

    gg->SetFilenameTargetDepends(sf,
                          this->OutputFileExpr->GetSourceSensitiveTargets());
    }
}